

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O3

int denoise(int argc,char **argv)

{
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pIVar1;
  anon_union_128_1_a7e8d694_for_InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_5
  *paVar2;
  char *__s;
  bool bVar3;
  Allocator AVar4;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar5;
  undefined8 extraout_RAX;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar6;
  _Alloc_hider _Var7;
  _Alloc_hider _Var8;
  int c;
  long *plVar9;
  Point2i PVar10;
  long lVar11;
  ulong uVar12;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  aVar13;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_01;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_02;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_03;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_04;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_05;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_06;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  char *local_8d0;
  char **argv_local;
  string inFilename;
  string outFilename;
  Image filteredVariance;
  ImageChannelDesc varianceDesc;
  ImageChannelDesc albedoDesc;
  ImageChannelDesc deltaZDesc;
  ImageChannelDesc zDesc;
  ImageChannelDesc rgbDesc;
  _Any_data local_678;
  code *local_668;
  code *local_660;
  ImageChannelValues jointSigmaIndir;
  ImageChannelDesc jointDesc;
  ImageChannelDesc nsDesc;
  ImageChannelDesc nDesc;
  ImageAndMetadata im;
  ColorEncodingHandle local_380;
  Float xySigmaIndir [2];
  ColorEncodingHandle local_370;
  Image result;
  Image denoisedImage;
  ImageChannelValues Ldenoised;
  undefined8 auStack_108 [2];
  string local_f8 [8];
  undefined8 uStack_f0;
  long alStack_e8 [7];
  undefined8 uStack_b0;
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> aStack_a8;
  undefined8 uStack_98;
  undefined8 local_90;
  optional<int> oStack_88;
  optional<float> oStack_80;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  aStack_78;
  undefined8 uStack_70;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  _Stack_68;
  
  inFilename._M_dataplus._M_p = (pointer)&inFilename.field_2;
  outFilename._M_dataplus._M_p = (pointer)&outFilename.field_2;
  inFilename._M_string_length = 0;
  inFilename.field_2._M_local_buf[0] = '\0';
  outFilename._M_string_length = 0;
  outFilename.field_2._M_local_buf[0] = '\0';
  local_8d0 = "input image filename must be provided.";
  argv_local = argv;
  if (*argv == (char *)0x0) {
LAB_00244687:
    usage("denoise",local_8d0);
  }
  pIVar1 = &im.image.channelNames;
  do {
    im.image._0_8_ = pIVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&im,"outfile","");
    local_678._M_unused._M_object = (void *)0x0;
    local_678._8_8_ = 0;
    local_660 = std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:2030:20)>
                ::_M_invoke;
    local_668 = std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:2030:20)>
                ::_M_manager;
    bVar3 = pbrt::ParseArg<std::__cxx11::string*>
                      (&argv_local,(string *)&im,&outFilename,
                       (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        *)&local_678);
    if (local_668 != (code *)0x0) {
      (*local_668)(&local_678,&local_678,__destroy_functor);
    }
    if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)im.image._0_8_ != pIVar1) {
      operator_delete((void *)im.image._0_8_,
                      (ulong)((long)&(im.image.channelNames.alloc.memoryResource)->
                                     _vptr_memory_resource + 1));
    }
    if (!bVar3) {
      __s = *argv_local;
      if (*__s == '-') {
        usage("denoise","%s: unknown command flag",__s);
      }
      if (inFilename._M_string_length != 0) {
        local_8d0 = "multiple input filenames provided.";
        goto LAB_00244687;
      }
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&inFilename,0,(char *)0x0,(ulong)__s);
      argv_local = argv_local + 1;
    }
  } while (*argv_local != (char *)0x0);
  if (inFilename._M_string_length == 0) goto LAB_00244687;
  if (outFilename._M_string_length == 0) {
    local_8d0 = "output image filename must be provided.";
    goto LAB_00244687;
  }
  AVar4.memoryResource = pstd::pmr::new_delete_resource();
  local_370.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  pbrt::Image::Read(&im,&inFilename,AVar4,&local_370);
  pIVar1 = &filteredVariance.channelNames;
  filteredVariance._0_8_ = pIVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&filteredVariance,"R","");
  _Var8._M_p = (pointer)((long)&filteredVariance.channelNames.field_2 + 0x10);
  filteredVariance.channelNames.field_2.fixed[0]._M_dataplus._M_p = (_Alloc_hider)_Var8._M_p;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&filteredVariance.channelNames.field_2,"G","");
  _Var7._M_p = (pointer)((long)&filteredVariance.channelNames.field_2 + 0x30);
  filteredVariance.channelNames.field_2.fixed[1]._M_dataplus._M_p = (_Alloc_hider)_Var7._M_p;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&filteredVariance.channelNames.field_2 + 0x20),"B","");
  requestedChannels.n = 3;
  requestedChannels.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&filteredVariance;
  pbrt::Image::GetChannelDesc(&rgbDesc,&im.image,requestedChannels);
  lVar11 = -0x60;
  do {
    if ((long *)_Var7._M_p != *(long **)((long)_Var7._M_p + -0x10)) {
      operator_delete(*(long **)((long)_Var7._M_p + -0x10),*(long *)_Var7._M_p + 1);
    }
    _Var7._M_p = _Var7._M_p + -0x20;
    lVar11 = lVar11 + 0x20;
  } while (lVar11 != 0);
  if (rgbDesc.offset.nStored == 0) {
    denoise();
LAB_002446ad:
    denoise();
LAB_002446b7:
    denoise();
LAB_002446c1:
    denoise();
LAB_002446cb:
    denoise();
  }
  else {
    filteredVariance._0_8_ = pIVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&filteredVariance,"Pz","");
    requestedChannels_00.n = 1;
    requestedChannels_00.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&filteredVariance;
    pbrt::Image::GetChannelDesc(&zDesc,&im.image,requestedChannels_00);
    if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)filteredVariance._0_8_ != pIVar1) {
      operator_delete((void *)filteredVariance._0_8_,
                      (ulong)((long)&(filteredVariance.channelNames.alloc.memoryResource)->
                                     _vptr_memory_resource + 1));
    }
    if (zDesc.offset.nStored == 0) goto LAB_002446ad;
    filteredVariance._0_8_ = pIVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&filteredVariance,"dzdx","");
    paVar2 = &filteredVariance.channelNames.field_2;
    filteredVariance.channelNames.field_2.fixed[0]._M_dataplus._M_p = (_Alloc_hider)_Var8._M_p;
    std::__cxx11::string::_M_construct<char_const*>((string *)paVar2,"dzdy","");
    requestedChannels_01.n = 2;
    requestedChannels_01.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&filteredVariance;
    pbrt::Image::GetChannelDesc(&deltaZDesc,&im.image,requestedChannels_01);
    lVar11 = -0x40;
    do {
      if ((long *)_Var8._M_p != *(long **)((long)_Var8._M_p + -0x10)) {
        operator_delete(*(long **)((long)_Var8._M_p + -0x10),*(long *)_Var8._M_p + 1);
      }
      _Var8._M_p = _Var8._M_p + -0x20;
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0);
    if (deltaZDesc.offset.nStored == 0) goto LAB_002446b7;
    filteredVariance._0_8_ = pIVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&filteredVariance,"Nx","");
    _Var8._M_p = (pointer)((long)&filteredVariance.channelNames.field_2 + 0x10);
    filteredVariance.channelNames.field_2.fixed[0]._M_dataplus._M_p = (_Alloc_hider)_Var8._M_p;
    std::__cxx11::string::_M_construct<char_const*>((string *)paVar2,"Ny","");
    _Var7._M_p = (pointer)((long)&filteredVariance.channelNames.field_2 + 0x30);
    filteredVariance.channelNames.field_2.fixed[1]._M_dataplus._M_p = (_Alloc_hider)_Var7._M_p;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&filteredVariance.channelNames.field_2 + 0x20),"Nz","");
    requestedChannels_02.n = 3;
    requestedChannels_02.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&filteredVariance;
    pbrt::Image::GetChannelDesc(&nDesc,&im.image,requestedChannels_02);
    lVar11 = -0x60;
    do {
      if ((long *)_Var7._M_p != *(long **)((long)_Var7._M_p + -0x10)) {
        operator_delete(*(long **)((long)_Var7._M_p + -0x10),*(long *)_Var7._M_p + 1);
      }
      _Var7._M_p = _Var7._M_p + -0x20;
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0);
    if (nDesc.offset.nStored == 0) goto LAB_002446c1;
    filteredVariance._0_8_ = pIVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&filteredVariance,"Nsx","");
    filteredVariance.channelNames.field_2.fixed[0]._M_dataplus._M_p = (_Alloc_hider)_Var8._M_p;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&filteredVariance.channelNames.field_2,"Nsy","");
    _Var7._M_p = (pointer)((long)&filteredVariance.channelNames.field_2 + 0x30);
    filteredVariance.channelNames.field_2.fixed[1]._M_dataplus._M_p = (_Alloc_hider)_Var7._M_p;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&filteredVariance.channelNames.field_2 + 0x20),"Nsz","");
    requestedChannels_03.n = 3;
    requestedChannels_03.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&filteredVariance;
    pbrt::Image::GetChannelDesc(&nsDesc,&im.image,requestedChannels_03);
    lVar11 = -0x60;
    do {
      if ((long *)_Var7._M_p != *(long **)((long)_Var7._M_p + -0x10)) {
        operator_delete(*(long **)((long)_Var7._M_p + -0x10),*(long *)_Var7._M_p + 1);
      }
      _Var7._M_p = _Var7._M_p + -0x20;
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0);
    if (nsDesc.offset.nStored == 0) goto LAB_002446cb;
    filteredVariance._0_8_ = pIVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&filteredVariance,"Albedo.R","");
    filteredVariance.channelNames.field_2.fixed[0]._M_dataplus._M_p = (_Alloc_hider)_Var8._M_p;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&filteredVariance.channelNames.field_2,"Albedo.G","");
    _Var7._M_p = (pointer)((long)&filteredVariance.channelNames.field_2 + 0x30);
    filteredVariance.channelNames.field_2.fixed[1]._M_dataplus._M_p = (_Alloc_hider)_Var7._M_p;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&filteredVariance.channelNames.field_2 + 0x20),"Albedo.B","");
    requestedChannels_04.n = 3;
    requestedChannels_04.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&filteredVariance;
    pbrt::Image::GetChannelDesc(&albedoDesc,&im.image,requestedChannels_04);
    lVar11 = -0x60;
    do {
      if ((long *)_Var7._M_p != *(long **)((long)_Var7._M_p + -0x10)) {
        operator_delete(*(long **)((long)_Var7._M_p + -0x10),*(long *)_Var7._M_p + 1);
      }
      _Var7._M_p = _Var7._M_p + -0x20;
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0);
    if (albedoDesc.offset.nStored != 0) {
      filteredVariance._0_8_ = pIVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&filteredVariance,"rgbVariance","");
      requestedChannels_05.n = 1;
      requestedChannels_05.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&filteredVariance;
      pbrt::Image::GetChannelDesc(&varianceDesc,&im.image,requestedChannels_05);
      if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)filteredVariance._0_8_ != pIVar1) {
        operator_delete((void *)filteredVariance._0_8_,
                        (ulong)((long)&(filteredVariance.channelNames.alloc.memoryResource)->
                                       _vptr_memory_resource + 1));
      }
      if (varianceDesc.offset.nStored != 0) {
        filteredVariance._0_8_ = pIVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&filteredVariance,"Pz","");
        filteredVariance.channelNames.field_2.fixed[0]._M_dataplus._M_p = (_Alloc_hider)_Var8._M_p;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&filteredVariance.channelNames.field_2,"Nx","");
        filteredVariance.channelNames.field_2.fixed[1]._M_dataplus._M_p =
             (_Alloc_hider)((long)&filteredVariance.channelNames.field_2 + 0x30);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)((long)&filteredVariance.channelNames.field_2 + 0x20),"Ny","");
        _Var8._M_p = (pointer)((long)&filteredVariance.channelNames.field_2 + 0x50);
        filteredVariance.channelNames.field_2.fixed[2]._M_dataplus._M_p = (_Alloc_hider)_Var8._M_p;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)((long)&filteredVariance.channelNames.field_2 + 0x40),"Nz","");
        requestedChannels_06.n = 4;
        requestedChannels_06.ptr =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&filteredVariance;
        pbrt::Image::GetChannelDesc(&jointDesc,&im.image,requestedChannels_06);
        lVar11 = -0x80;
        do {
          if ((long *)_Var8._M_p != *(long **)((long)_Var8._M_p + -0x10)) {
            operator_delete(*(long **)((long)_Var8._M_p + -0x10),*(long *)_Var8._M_p + 1);
          }
          _Var8._M_p = _Var8._M_p + -0x20;
          lVar11 = lVar11 + 0x20;
        } while (lVar11 != 0);
        jointSigmaIndir.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
        alloc.memoryResource = pstd::pmr::new_delete_resource();
        jointSigmaIndir.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr
             = (float *)0x0;
        jointSigmaIndir.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
        nAlloc = 0;
        jointSigmaIndir.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
        nStored = 0;
        pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::reserve
                  (&jointSigmaIndir.
                    super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>,4);
        aVar13.fixed[2] = 1.0;
        aVar13._0_8_ = 0x3f8000003f800000;
        aVar13.fixed[3] = 1.0;
        paVar6 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                  *)jointSigmaIndir.
                    super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr;
        if (jointSigmaIndir.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
            ptr == (float *)0x0) {
          paVar6 = &jointSigmaIndir.
                    super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.field_2;
        }
        *paVar6 = aVar13;
        jointSigmaIndir.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
        nStored = 4;
        xySigmaIndir[0] = 2.0;
        xySigmaIndir[1] = 2.0;
        pbrt::Image::JointBilateralFilter
                  (&filteredVariance,&im.image,&varianceDesc,7,xySigmaIndir,&jointDesc,
                   (ImageChannelValues *)
                   &jointSigmaIndir.
                    super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>);
        denoiseImage(&denoisedImage,&im.image,&rgbDesc,&filteredVariance,&albedoDesc,&zDesc,
                     &deltaZDesc,&nsDesc,3,3);
        PVar10.super_Tuple2<pbrt::Point2,_int>.y =
             im.image.resolution.super_Tuple2<pbrt::Point2,_int>.y;
        PVar10.super_Tuple2<pbrt::Point2,_int>.x =
             im.image.resolution.super_Tuple2<pbrt::Point2,_int>.x;
        paVar6 = &Ldenoised.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                  field_2;
        Ldenoised.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.alloc.
        memoryResource = (memory_resource *)paVar6;
        std::__cxx11::string::_M_construct<char_const*>((string *)&Ldenoised,"R","");
        Ldenoised.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.nAlloc =
             (size_t)auStack_108;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)
                   &Ldenoised.
                    super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.nAlloc,
                   "G","");
        plVar9 = alStack_e8;
        local_f8 = (string  [8])plVar9;
        std::__cxx11::string::_M_construct<char_const*>(local_f8,"B","");
        local_380.
        super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
        .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                 )0;
        AVar4.memoryResource = pstd::pmr::new_delete_resource();
        channels.n = 3;
        channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &Ldenoised;
        pbrt::Image::Image(&result,Float,PVar10,channels,&local_380,AVar4);
        lVar11 = -0x60;
        do {
          if (plVar9 != (long *)plVar9[-2]) {
            operator_delete((long *)plVar9[-2],*plVar9 + 1);
          }
          plVar9 = plVar9 + -4;
          lVar11 = lVar11 + 0x20;
        } while (lVar11 != 0);
        lVar11 = CONCAT44(im.image.resolution.super_Tuple2<pbrt::Point2,_int>.y,
                          im.image.resolution.super_Tuple2<pbrt::Point2,_int>.x);
        if (0 < im.image.resolution.super_Tuple2<pbrt::Point2,_int>.y) {
          local_8d0 = (char *)0x0;
          do {
            if (0 < (int)lVar11) {
              uVar12 = 0;
              do {
                PVar10.super_Tuple2<pbrt::Point2,_int> =
                     (Tuple2<pbrt::Point2,_int>)((long)local_8d0 << 0x20 | uVar12);
                pbrt::Image::GetChannels(&Ldenoised,&denoisedImage,PVar10,(WrapMode2D)0x200000002);
                lVar11 = 0;
                do {
                  paVar5 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                            *)Ldenoised.
                              super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                              .ptr;
                  if (Ldenoised.
                      super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr ==
                      (float *)0x0) {
                    paVar5 = paVar6;
                  }
                  pbrt::Image::SetChannel(&result,PVar10,(int)lVar11,paVar5->fixed[lVar11]);
                  lVar11 = lVar11 + 1;
                } while (lVar11 != 3);
                Ldenoised.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                nStored = 0;
                (*(Ldenoised.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                   .alloc.memoryResource)->_vptr_memory_resource[3])
                          (Ldenoised.
                           super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                           alloc.memoryResource,
                           Ldenoised.
                           super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                           ptr,Ldenoised.
                               super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                               .nAlloc << 2,4);
                lVar11 = CONCAT44(im.image.resolution.super_Tuple2<pbrt::Point2,_int>.y,
                                  im.image.resolution.super_Tuple2<pbrt::Point2,_int>.x);
                uVar12 = uVar12 + 1;
              } while ((long)uVar12 < (long)im.image.resolution.super_Tuple2<pbrt::Point2,_int>.x);
            }
            local_8d0 = (char *)((long)local_8d0 + 1);
          } while ((long)local_8d0 < lVar11 >> 0x20);
        }
        _Stack_68._M_impl.super__Rb_tree_header._M_header._M_left =
             &_Stack_68._M_impl.super__Rb_tree_header._M_header;
        aStack_78 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                     )0x0;
        uStack_70._0_1_ = false;
        uStack_70._1_7_ = 0;
        _Stack_68._M_impl._0_8_ = 0;
        _Stack_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        _Stack_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        _Stack_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        alStack_e8[6] = 0;
        uStack_b0 = 0;
        aStack_a8._0_8_ = 0;
        aStack_a8._8_8_ = 0;
        uStack_98 = 0;
        local_90 = 0;
        oStack_88.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
        oStack_88.set = false;
        oStack_88._5_3_ = 0;
        oStack_80.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
        oStack_80.set = false;
        oStack_80._5_3_ = 0;
        local_f8[0] = (string)0x0;
        local_f8[1] = (string)0x0;
        local_f8[2] = (string)0x0;
        local_f8[3] = (string)0x0;
        local_f8[4] = (string)0x0;
        local_f8[5] = (string)0x0;
        local_f8[6] = (string)0x0;
        local_f8[7] = (string)0x0;
        uStack_f0 = 0;
        alStack_e8[0] = 0;
        alStack_e8[1] = 0;
        alStack_e8[2] = 0;
        alStack_e8[3] = 0;
        alStack_e8[4] = 0;
        alStack_e8[5] = 0;
        Ldenoised.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.alloc.
        memoryResource = (memory_resource *)0x0;
        Ldenoised.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr =
             (float *)0x0;
        Ldenoised.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.field_2.
        _0_8_ = 0;
        Ldenoised.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.field_2.
        _8_8_ = 0;
        Ldenoised.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.nAlloc = 0
        ;
        Ldenoised.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.nStored =
             0;
        auStack_108[0] = 0;
        auStack_108[1] = 0;
        _Stack_68._M_impl.super__Rb_tree_header._M_node_count = 0;
        _Stack_68._M_impl.super__Rb_tree_header._M_header._M_right =
             _Stack_68._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar3 = pbrt::Image::Write(&result,&outFilename,(ImageMetadata *)&Ldenoised);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::~_Rb_tree(&_Stack_68);
        if (!bVar3) {
          denoise();
        }
        result.p32.nStored = 0;
        (*(result.p32.alloc.memoryResource)->_vptr_memory_resource[3])
                  (result.p32.alloc.memoryResource,result.p32.ptr,result.p32.nAlloc << 2,4);
        result.p16.nStored = 0;
        (*(result.p16.alloc.memoryResource)->_vptr_memory_resource[3])
                  (result.p16.alloc.memoryResource,result.p16.ptr,result.p16.nAlloc * 2,2);
        result.p8.nStored = 0;
        (*(result.p8.alloc.memoryResource)->_vptr_memory_resource[3])
                  (result.p8.alloc.memoryResource,result.p8.ptr,result.p8.nAlloc,1);
        pbrt::
        InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~InlinedVector(&result.channelNames);
        denoisedImage.p32.nStored = 0;
        (*(denoisedImage.p32.alloc.memoryResource)->_vptr_memory_resource[3])
                  (denoisedImage.p32.alloc.memoryResource,denoisedImage.p32.ptr,
                   denoisedImage.p32.nAlloc << 2,4);
        denoisedImage.p16.nStored = 0;
        (*(denoisedImage.p16.alloc.memoryResource)->_vptr_memory_resource[3])
                  (denoisedImage.p16.alloc.memoryResource,denoisedImage.p16.ptr,
                   denoisedImage.p16.nAlloc * 2,2);
        denoisedImage.p8.nStored = 0;
        (*(denoisedImage.p8.alloc.memoryResource)->_vptr_memory_resource[3])
                  (denoisedImage.p8.alloc.memoryResource,denoisedImage.p8.ptr,
                   denoisedImage.p8.nAlloc,1);
        pbrt::
        InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~InlinedVector(&denoisedImage.channelNames);
        filteredVariance.p32.nStored = 0;
        (*(filteredVariance.p32.alloc.memoryResource)->_vptr_memory_resource[3])
                  (filteredVariance.p32.alloc.memoryResource,filteredVariance.p32.ptr,
                   filteredVariance.p32.nAlloc << 2,4);
        filteredVariance.p16.nStored = 0;
        (*(filteredVariance.p16.alloc.memoryResource)->_vptr_memory_resource[3])
                  (filteredVariance.p16.alloc.memoryResource,filteredVariance.p16.ptr,
                   filteredVariance.p16.nAlloc * 2,2);
        filteredVariance.p8.nStored = 0;
        (*(filteredVariance.p8.alloc.memoryResource)->_vptr_memory_resource[3])
                  (filteredVariance.p8.alloc.memoryResource,filteredVariance.p8.ptr,
                   filteredVariance.p8.nAlloc,1);
        pbrt::
        InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~InlinedVector(&filteredVariance.channelNames);
        jointSigmaIndir.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
        nStored = 0;
        (*(jointSigmaIndir.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
           alloc.memoryResource)->_vptr_memory_resource[3])
                  (jointSigmaIndir.
                   super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.alloc.
                   memoryResource,
                   jointSigmaIndir.
                   super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr,
                   jointSigmaIndir.
                   super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.nAlloc <<
                   2,4);
        jointDesc.offset.nStored = 0;
        (*(jointDesc.offset.alloc.memoryResource)->_vptr_memory_resource[3])
                  (jointDesc.offset.alloc.memoryResource,jointDesc.offset.ptr,
                   jointDesc.offset.nAlloc << 2,4);
        varianceDesc.offset.nStored = 0;
        (*(varianceDesc.offset.alloc.memoryResource)->_vptr_memory_resource[3])
                  (varianceDesc.offset.alloc.memoryResource,varianceDesc.offset.ptr,
                   varianceDesc.offset.nAlloc << 2,4);
        albedoDesc.offset.nStored = 0;
        (*(albedoDesc.offset.alloc.memoryResource)->_vptr_memory_resource[3])
                  (albedoDesc.offset.alloc.memoryResource,albedoDesc.offset.ptr,
                   albedoDesc.offset.nAlloc << 2,4);
        nsDesc.offset.nStored = 0;
        (*(nsDesc.offset.alloc.memoryResource)->_vptr_memory_resource[3])
                  (nsDesc.offset.alloc.memoryResource,nsDesc.offset.ptr,nsDesc.offset.nAlloc << 2,4)
        ;
        nDesc.offset.nStored = 0;
        (*(nDesc.offset.alloc.memoryResource)->_vptr_memory_resource[3])
                  (nDesc.offset.alloc.memoryResource,nDesc.offset.ptr,nDesc.offset.nAlloc << 2,4);
        deltaZDesc.offset.nStored = 0;
        (*(deltaZDesc.offset.alloc.memoryResource)->_vptr_memory_resource[3])
                  (deltaZDesc.offset.alloc.memoryResource,deltaZDesc.offset.ptr,
                   deltaZDesc.offset.nAlloc << 2,4);
        zDesc.offset.nStored = 0;
        (*(zDesc.offset.alloc.memoryResource)->_vptr_memory_resource[3])
                  (zDesc.offset.alloc.memoryResource,zDesc.offset.ptr,zDesc.offset.nAlloc << 2,4);
        rgbDesc.offset.nStored = 0;
        (*(rgbDesc.offset.alloc.memoryResource)->_vptr_memory_resource[3])
                  (rgbDesc.offset.alloc.memoryResource,rgbDesc.offset.ptr,rgbDesc.offset.nAlloc << 2
                   ,4);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::~_Rb_tree(&im.metadata.stringVectors._M_t);
        if (im.metadata.colorSpace.set == true) {
          im.metadata.colorSpace.set = false;
        }
        if (im.metadata.MSE.set == true) {
          im.metadata.MSE.set = false;
        }
        if (im.metadata.samplesPerPixel.set == true) {
          im.metadata.samplesPerPixel.set = false;
        }
        if (im.metadata.fullResolution.set == true) {
          im.metadata.fullResolution.set = false;
        }
        if (im.metadata.pixelBounds.set == true) {
          im.metadata.pixelBounds.set = false;
        }
        if (im.metadata.NDCFromWorld.set == true) {
          im.metadata.NDCFromWorld.set = false;
        }
        if (im.metadata.cameraFromWorld.set == true) {
          im.metadata.cameraFromWorld.set = false;
        }
        if (im.metadata.renderTimeSeconds.set == true) {
          im.metadata.renderTimeSeconds.set = false;
        }
        im.image.p32.nStored = 0;
        (*(im.image.p32.alloc.memoryResource)->_vptr_memory_resource[3])
                  (im.image.p32.alloc.memoryResource,im.image.p32.ptr,im.image.p32.nAlloc << 2,4);
        im.image.p16.nStored = 0;
        (*(im.image.p16.alloc.memoryResource)->_vptr_memory_resource[3])
                  (im.image.p16.alloc.memoryResource,im.image.p16.ptr,im.image.p16.nAlloc * 2,2);
        im.image.p8.nStored = 0;
        (*(im.image.p8.alloc.memoryResource)->_vptr_memory_resource[3])
                  (im.image.p8.alloc.memoryResource,im.image.p8.ptr,im.image.p8.nAlloc,1);
        pbrt::
        InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~InlinedVector(&im.image.channelNames);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)outFilename._M_dataplus._M_p != &outFilename.field_2) {
          operator_delete(outFilename._M_dataplus._M_p,
                          CONCAT71(outFilename.field_2._M_allocated_capacity._1_7_,
                                   outFilename.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)inFilename._M_dataplus._M_p != &inFilename.field_2) {
          operator_delete(inFilename._M_dataplus._M_p,
                          CONCAT71(inFilename.field_2._M_allocated_capacity._1_7_,
                                   inFilename.field_2._M_local_buf[0]) + 1);
        }
        return (uint)!bVar3;
      }
      goto LAB_002446df;
    }
  }
  denoise();
LAB_002446df:
  denoise();
  __clang_call_terminate(extraout_RAX);
}

Assistant:

int denoise(int argc, char *argv[]) {
    std::string inFilename, outFilename;

    auto onError = [](const std::string &err) {
        usage("denoise", "%s", err.c_str());
        exit(1);
    };
    while (*argv != nullptr) {
        if (ParseArg(&argv, "outfile", &outFilename, onError)) {
            // success
        } else if (argv[0][0] == '-')
            usage("denoise", "%s: unknown command flag", *argv);
        else if (inFilename.empty()) {
            inFilename = *argv;
            ++argv;
        } else
            usage("denoise", "multiple input filenames provided.");
    }
    if (inFilename.empty())
        usage("denoise", "input image filename must be provided.");
    if (outFilename.empty())
        usage("denoise", "output image filename must be provided.");

    ImageAndMetadata im = Image::Read(inFilename);
    Image &in = im.image;

    auto checkForChannels = [&inFilename](ImageChannelDesc &desc, const char *names) {
        if (!desc) {
            fprintf(stderr, "%s: didn't find \"%s\" channels.\n", inFilename.c_str(),
                    names);
            exit(1);
        }
    };
    ImageChannelDesc rgbDesc = in.GetChannelDesc({"R", "G", "B"});
    checkForChannels(rgbDesc, "R,G,B");
    ImageChannelDesc zDesc = in.GetChannelDesc({"Pz"});
    checkForChannels(zDesc, "Pz");
    ImageChannelDesc deltaZDesc = in.GetChannelDesc({"dzdx", "dzdy"});
    checkForChannels(deltaZDesc, "dzdx,dzdy");
    ImageChannelDesc nDesc = in.GetChannelDesc({"Nx", "Ny", "Nz"});
    checkForChannels(nDesc, "Nx,Ny,Nz");
    ImageChannelDesc nsDesc = in.GetChannelDesc({"Nsx", "Nsy", "Nsz"});
    checkForChannels(nsDesc, "Nsx,Nsy,Nsz");
    ImageChannelDesc albedoDesc = in.GetChannelDesc({"Albedo.R", "Albedo.G", "Albedo.B"});
    checkForChannels(albedoDesc, "Albedo.R,Albedo.G,Albedo.B");
    ImageChannelDesc varianceDesc = in.GetChannelDesc({"rgbVariance"});
    checkForChannels(varianceDesc, "rgbVariance");

    ImageChannelDesc jointDesc = in.GetChannelDesc({"Pz", "Nx", "Ny", "Nz"});
    ImageChannelValues jointSigmaIndir(4, 1);
    Float xySigmaIndir[2] = {2.f, 2.f};
    Image filteredVariance = in.JointBilateralFilter(varianceDesc, 7, xySigmaIndir,
                                                     jointDesc, jointSigmaIndir);

    int halfWidth = 3;
    int nLevels = 3;
    Image denoisedImage = denoiseImage(in, rgbDesc, filteredVariance, albedoDesc, zDesc,
                                       deltaZDesc, nsDesc, halfWidth, nLevels);

    Image result(PixelFormat::Float, in.Resolution(), {"R", "G", "B"});
    for (int y = 0; y < in.Resolution().y; ++y)
        for (int x = 0; x < in.Resolution().x; ++x) {
            ImageChannelValues Ldenoised = denoisedImage.GetChannels({x, y});
            for (int c = 0; c < 3; ++c)
                result.SetChannel({x, y}, c, Ldenoised[c]);
        }

    if (!result.Write(outFilename)) {
        fprintf(stderr, "%s: couldn't write image.\n", outFilename.c_str());
        return 1;
    }
    return 0;
}